

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

optional<unsigned_long> find_in_table(token *token,char **table,string_view prefix)

{
  long lVar1;
  int iVar2;
  _Storage<unsigned_long,_true> _Var3;
  _Storage<unsigned_long,_true> _Var4;
  ulong unaff_RBP;
  char *__s;
  size_type __rlen;
  _Storage<unsigned_long,_true> _Var5;
  _Storage<unsigned_long,_true> unaff_R15;
  bool bVar6;
  bool bVar7;
  optional<unsigned_long> oVar8;
  char *local_38;
  
  _Var4._M_value = prefix._M_len;
  if (token->type == identifier) {
    _Var5 = (_Storage<unsigned_long,_true>)(token->data).string._M_len;
    local_38 = (token->data).string._M_str;
    if (_Var4._M_value != 0) {
      if (_Var5._M_value == 0) {
        bVar7 = true;
      }
      else {
        _Var3._M_value = _Var4._M_value;
        if (_Var5._M_value < _Var4._M_value) {
          _Var3 = _Var5;
        }
        iVar2 = bcmp(prefix._M_str,local_38,_Var3._M_value);
        bVar7 = iVar2 == 0;
      }
      bVar6 = _Var4._M_value <= _Var5._M_value;
      _Var5._M_value = _Var5._M_value - _Var4._M_value;
      unaff_R15._M_value = _Var4._M_value;
      if (!(bool)(bVar6 & bVar7)) goto LAB_0012ece7;
      local_38 = local_38 + _Var4._M_value;
    }
    unaff_R15._M_value = 0;
    __s = *table;
    while (__s != (char *)0x0) {
      _Var3._M_value = strlen(__s);
      _Var4._M_value = _Var3._M_value;
      if (_Var5._M_value < _Var3._M_value) {
        _Var4 = _Var5;
      }
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
      bVar7 = true;
      if (_Var4._M_value != 0) {
        iVar2 = bcmp(local_38,__s,_Var4._M_value);
        bVar7 = iVar2 == 0;
      }
      if ((bVar7) && (_Var5._M_value == _Var3._M_value)) goto LAB_0012eced;
      lVar1 = unaff_R15._M_value + 1;
      unaff_R15._M_value = unaff_R15._M_value + 1;
      __s = table[lVar1];
    }
    unaff_RBP = 0;
  }
  else {
LAB_0012ece7:
    unaff_RBP = 0;
  }
LAB_0012eced:
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = unaff_RBP & 0xffffffff;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R15._M_value;
  return (optional<unsigned_long>)
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> find_in_table(const token& token, const char* const* table,
                                      std::string_view prefix)
{
    if (token.type != token_type::identifier) {
        return {};
    }

    std::string_view text = token.data.string;

    if (!prefix.empty()) {
        if (prefix.compare(text.substr(0, std::size(prefix))) != 0) {
            return {};
        }
        text = text.substr(std::size(prefix));
    }

    for (size_t i = 0; table[i]; ++i) {
        if (text.compare(table[i]) != 0) {
            continue;
        }
        return static_cast<uint64_t>(i);
    }
    return {};
}